

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBuilderBeamIGA::BuildBeam
          (ChBuilderBeamIGA *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCosserat> *sect,int N,ChVector<double> *A,
          ChVector<double> *B,ChVector<double> *Ydir,int order)

{
  ChMesh *pCVar1;
  double dVar2;
  int iVar3;
  ChNodeFEAxyzrot *this_00;
  long lVar4;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *pvVar5;
  ChVector<double> *mv;
  int iVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> hnode_i;
  ChVectorDynamic<> myknots;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  mynodes;
  ChMatrix33<double> mrot;
  ChVector<double> mX;
  ChVector<double> mY;
  long local_290;
  ChVector<double> local_288;
  double local_268;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *local_260;
  value_type local_258;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_248;
  shared_ptr<chrono::fea::ChMesh> *local_230;
  shared_ptr<chrono::fea::ChElementBase> local_228;
  element_type *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_208;
  ChVector<double> local_1f8;
  ulong local_1e0;
  _func_int **local_1d8;
  ChBuilderBeamIGA *local_1d0;
  shared_ptr<chrono::fea::ChBeamSectionCosserat> *local_1c8;
  vector<double,_std::allocator<double>_> local_1c0;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  local_1a8;
  ChMatrix33<double> local_190;
  ChFrame<double> local_148;
  ChFrame<double> local_b8;
  
  local_230 = mesh;
  local_1c8 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ::clear(&this->beam_elems);
  local_260 = &this->beam_nodes;
  local_1d0 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(local_260);
  local_288.m_data[0] = B->m_data[0] - A->m_data[0];
  local_288.m_data[1] = B->m_data[1] - A->m_data[1];
  local_288.m_data[2] = B->m_data[2] - A->m_data[2];
  local_148.coord.pos.m_data[1] = 0.0;
  local_148._vptr_ChFrame = (_func_int **)0x0;
  local_148.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)0x0;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_1f8.m_data[2] = 0.0;
  local_1f8.m_data[0] = 0.0;
  local_1f8.m_data[1] = 0.0;
  ChVector<double>::DirToDxDyDz
            (&local_288,(ChVector<double> *)&local_148,(ChVector<double> *)&local_b8,&local_1f8,Ydir
            );
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_148._vptr_ChFrame;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_b8._vptr_ChFrame;
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_1f8.m_data[0];
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_148.coord.pos.m_data[0];
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_b8.coord.pos.m_data[0];
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_1f8.m_data[1];
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_148.coord.pos.m_data[1];
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_b8.coord.pos.m_data[1];
  local_190.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_1f8.m_data[2];
  iVar3 = order + N;
  local_248.m_storage.m_data = (double *)0x0;
  local_248.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_248,(long)(order + 1 + iVar3));
  local_1e0 = (ulong)(uint)N;
  geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds
            ((ChVectorDynamic<> *)&local_248,order,0.0,1.0);
  local_1f8.m_data[0] = 0.0;
  local_1f8.m_data[1] = 0.0;
  local_1f8.m_data[2] = 0.0;
  if (0 < iVar3) {
    local_268 = (double)(iVar3 + -1);
    iVar6 = 0;
    local_1d8 = (_func_int **)&PTR__ChFrame_00b2b308;
    do {
      dVar9 = (double)iVar6 / local_268;
      local_288.m_data[0] = A->m_data[0] + dVar9 * (B->m_data[0] - A->m_data[0]);
      local_288.m_data[1] = A->m_data[1] + dVar9 * (B->m_data[1] - A->m_data[1]);
      local_288.m_data[2] = A->m_data[2] + dVar9 * (B->m_data[2] - A->m_data[2]);
      mv = &local_288;
      ChFrame<double>::ChFrame(&local_b8,mv,&local_190);
      this_00 = (ChNodeFEAxyzrot *)
                ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mv);
      local_148._vptr_ChFrame = local_1d8;
      local_148.coord.pos.m_data[0] = local_b8.coord.pos.m_data[0];
      local_148.coord.pos.m_data[1] = local_b8.coord.pos.m_data[1];
      local_148.coord.pos.m_data[2] = local_b8.coord.pos.m_data[2];
      local_148.coord.rot.m_data[0] = local_b8.coord.rot.m_data[0];
      local_148.coord.rot.m_data[1] = local_b8.coord.rot.m_data[1];
      local_148.coord.rot.m_data[2] = local_b8.coord.rot.m_data[2];
      local_148.coord.rot.m_data[3] = local_b8.coord.rot.m_data[3];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      local_148.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_b8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_00,&local_148);
      local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                (&local_258.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_00);
      pCVar1 = (local_230->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_208.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &(local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->super_ChNodeFEAbase;
      local_208.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_258.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_258.
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar1,&local_208);
      if (local_208.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                   *)&local_1f8,&local_258);
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(local_260,&local_258);
      if (local_258.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_258.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar6 = iVar6 + 1;
    } while (iVar3 != iVar6);
  }
  if (0 < (int)local_1e0) {
    local_260 = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 *)(ulong)(order + 1);
    local_268 = (double)(local_1e0 & 0xffffffff);
    lVar7 = 0;
    local_290 = 0;
    dVar9 = 0.0;
    do {
      local_148._vptr_ChFrame = (_func_int **)0x0;
      local_148.coord.pos.m_data[0] = 0.0;
      local_148.coord.pos.m_data[1] = 0.0;
      if (-1 < order) {
        lVar8 = 0;
        lVar4 = local_290;
        do {
          if (local_248.m_storage.m_rows <= (long)dVar9 + lVar8) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          if (local_148.coord.pos.m_data[0] == local_148.coord.pos.m_data[1]) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_148,
                       (iterator)local_148.coord.pos.m_data[0],
                       (double *)((long)local_248.m_storage.m_data + lVar4));
          }
          else {
            *(double *)local_148.coord.pos.m_data[0] =
                 *(double *)((long)local_248.m_storage.m_data + lVar4);
            local_148.coord.pos.m_data[0] = (double)((long)local_148.coord.pos.m_data[0] + 8);
          }
          lVar8 = lVar8 + 1;
          lVar4 = lVar4 + 8;
        } while ((ulong)(~(order * 2 >> 0x1f) & order * 2 + 1U) + 1 != lVar8);
      }
      local_b8._vptr_ChFrame = (_func_int **)0x0;
      local_b8.coord.pos.m_data[0] = 0.0;
      local_b8.coord.pos.m_data[1] = 0.0;
      pvVar5 = local_260;
      lVar4 = lVar7;
      if (-1 < order) {
        do {
          std::
          vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
          ::push_back((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       *)&local_b8,(value_type *)((long)local_1f8.m_data[0] + lVar4));
          lVar4 = lVar4 + 0x10;
          pvVar5 = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                    *)((long)&(((ChBuilderBeamIGA *)(pvVar5 + -1))->beam_elems).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        } while (pvVar5 != (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                            *)0x0);
      }
      local_288.m_data[0] = 0.0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamIGA,std::allocator<chrono::fea::ChElementBeamIGA>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288.m_data + 1),
                 (ChElementBeamIGA **)&local_288,
                 (allocator<chrono::fea::ChElementBeamIGA> *)&local_258);
      dVar2 = local_288.m_data[0];
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::vector(&local_1a8,
               (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                *)&local_b8);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_1c0,(vector<double,_std::allocator<double>_> *)&local_148);
      (*(*(_func_int ***)dVar2)[0x1c])(dVar2,&local_1a8,&local_1c0,(ulong)(uint)order);
      if (local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::~vector(&local_1a8);
      local_218 = (local_1c8->
                  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      local_210._M_pi =
           (local_1c8->
           super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_210._M_pi)->_M_use_count = (local_210._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_210._M_pi)->_M_use_count = (local_210._M_pi)->_M_use_count + 1;
        }
      }
      ((element_type *)((long)local_288.m_data[0] + 0x188))->_vptr_ChElementBase =
           (_func_int **)local_218;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.m_data[0] + 400),
                 &local_210);
      if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
      }
      pCVar1 = (local_230->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_228.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_288.m_data[0];
      local_228.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.m_data[1];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_288.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_288.m_data[1] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_288.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_288.m_data[1] + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar1,&local_228);
      if (local_228.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
      ::push_back(&local_1d0->beam_elems,(value_type *)&local_288);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.m_data[1]);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                 *)&local_b8);
      if (local_148._vptr_ChFrame != (_func_int **)0x0) {
        operator_delete(local_148._vptr_ChFrame,
                        (long)local_148.coord.pos.m_data[1] - (long)local_148._vptr_ChFrame);
      }
      dVar9 = (double)((long)dVar9 + 1);
      local_290 = local_290 + 8;
      lVar7 = lVar7 + 0x10;
    } while (dVar9 != local_268);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::~vector((vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             *)&local_1f8);
  if (local_248.m_storage.m_data != (double *)0x0) {
    free((void *)local_248.m_storage.m_data[-1]);
  }
  return;
}

Assistant:

void ChBuilderBeamIGA::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                 std::shared_ptr<ChBeamSectionCosserat> sect,  // section material for beam elements
                                 const int N,                                  // number of elements in the segment
                                 const ChVector<> A,                           // starting point
                                 const ChVector<> B,                           // ending point
                                 const ChVector<> Ydir,                        // the 'up' Y direction of the beam
                                 const int order                               // the order of spline (default=3,cubic)
) {
    beam_elems.clear();
    beam_nodes.clear();

    // rotation of all nodes
    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - A, Ydir);

    int p = order;

    // Create the 'complete' knot vector, with multiple at the ends
    ChVectorDynamic<> myknots(N + p + p + 1);
    geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(myknots, p, 0.0, 1.0);

    // Create the 'complete' stl vector of control points, with uniform distribution
    std::vector<std::shared_ptr<ChNodeFEAxyzrot>> mynodes;
    for (int i_node = 0; i_node < N + p; ++i_node) {
        double abscyssa = ((double)i_node / (double)(N + p - 1));

        // position of node
        ChVector<> pos = A + (B - A) * abscyssa;

        auto hnode_i = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(hnode_i);
        mynodes.push_back(hnode_i);
        this->beam_nodes.push_back(hnode_i);
    }

    // Create the single elements by picking a subset of the nodes and control points
    for (int i_el = 0; i_el < N; ++i_el) {
        std::vector<double> my_el_knots;
        for (int i_el_knot = 0; i_el_knot < p + p + 1 + 1; ++i_el_knot) {
            my_el_knots.push_back(myknots(i_el + i_el_knot));
        }

        std::vector<std::shared_ptr<ChNodeFEAxyzrot>> my_el_nodes;
        for (int i_el_node = 0; i_el_node < p + 1; ++i_el_node) {
            my_el_nodes.push_back(mynodes[i_el + i_el_node]);
        }

        auto belement_i = chrono_types::make_shared<ChElementBeamIGA>();
        belement_i->SetNodesGenericOrder(my_el_nodes, my_el_knots, p);
        belement_i->SetSection(sect);
        mesh->AddElement(belement_i);
        this->beam_elems.push_back(belement_i);
    }
}